

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

BigInteger * __thiscall BigInteger::operator+=(BigInteger *this,BigInteger *a)

{
  BigInteger *this_00;
  ulong uVar1;
  value_type vVar2;
  compare_t cVar3;
  unsigned_long *puVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  BigInteger *in_RSI;
  BigInteger *in_RDI;
  bool bVar8;
  uint dig;
  size_t i_1;
  BigInteger *small;
  BigInteger *big;
  bool rev;
  size_t i;
  int rem;
  bool sub;
  value_type *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  value_type in_stack_ffffffffffffff44;
  value_type local_b4;
  BigInteger *in_stack_ffffffffffffff60;
  BigInteger *this_01;
  BigInteger *in_stack_ffffffffffffff68;
  value_type local_7c;
  ulong local_50;
  size_type local_30;
  size_type local_28;
  ulong local_20;
  uint local_18;
  undefined1 local_11;
  BigInteger *local_10;
  
  local_11 = (in_RDI->negative & 1U) != (in_RSI->negative & 1U);
  local_18 = 0;
  local_10 = in_RSI;
  if ((bool)local_11) {
    cVar3 = _compareAbs(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    this_01 = local_10;
    this_00 = in_RDI;
    if (cVar3 < CMP_EQUAL) {
      this_01 = in_RDI;
      this_00 = local_10;
    }
    in_RDI->negative = (bool)(this_00->negative & 1);
    for (local_50 = 0;
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_10->digits),
        local_50 < sVar5 || local_18 != 0; local_50 = local_50 + 1) {
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->digits);
      if (sVar5 <= local_50) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
      }
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_01->digits);
      if (local_50 < sVar5) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_01->digits,local_50);
        local_b4 = *pvVar7;
      }
      else {
        local_b4 = 0;
      }
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this_00->digits,local_50);
      bVar8 = *pvVar7 < local_b4 + local_18;
      if (bVar8) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_00->digits,local_50);
        in_stack_ffffffffffffff44 = ((*pvVar7 + 1000000000) - local_b4) - local_18;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->digits,local_50);
        *pvVar6 = in_stack_ffffffffffffff44;
      }
      else {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_00->digits,local_50);
        vVar2 = (*pvVar7 - local_b4) - local_18;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->digits,local_50);
        *pvVar6 = vVar2;
      }
      local_18 = (uint)bVar8;
    }
  }
  else {
    local_20 = 0;
    while( true ) {
      uVar1 = local_20;
      local_28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_10->digits);
      local_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->digits);
      puVar4 = std::max<unsigned_long>(&local_28,&local_30);
      if (*puVar4 <= uVar1 && local_18 == 0) break;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->digits);
      if (sVar5 <= local_20) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
      }
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->digits,local_20);
      vVar2 = *pvVar6;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_10->digits);
      if (local_20 < sVar5) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_10->digits,local_20);
        local_7c = *pvVar7;
      }
      else {
        local_7c = 0;
      }
      vVar2 = vVar2 + local_7c + local_18;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->digits,local_20);
      *pvVar6 = vVar2;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->digits,local_20);
      local_18 = *pvVar6 / 1000000000;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->digits,local_20);
      *pvVar6 = *pvVar6 % 1000000000;
      local_20 = local_20 + 1;
    }
  }
  normalize((BigInteger *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return in_RDI;
}

Assistant:

BigInteger &BigInteger::operator+=(const BigInteger &a) noexcept
{
    bool sub = negative ^a.negative;
    int rem = 0;
    if(!sub)  // addition
    {
        for(size_t i = 0; i < std::max(a.digits.size(), digits.size()) || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            digits[i] = digits[i] + (a.digits.size() > i ? a.digits[i] : 0) + rem;
            rem = digits[i] / BLOCK_MOD;
            digits[i] %= BLOCK_MOD;
        }
    }
    else
    {
        bool rev = _compareAbs(a) < 0;
        const BigInteger &big = (rev ? a : *this), &small = (rev ? *this : a);
        negative = big.negative;
        for(size_t i = 0; i < a.digits.size() || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            unsigned dig = (small.digits.size() > i ? small.digits[i] : 0);
            if(big.digits[i] >= dig + rem)
            {
                digits[i] = big.digits[i] - dig - rem;
                rem = 0;
            }
            else
            {
                digits[i] = BLOCK_MOD + big.digits[i] - dig - rem;
                rem = 1;
            }
        }
    }
    normalize();
    return *this;
}